

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_internal.h
# Opt level: O2

int exploration::
    sample_after_normalizing<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
              (long seed,float *pdf_first,float *pdf_last,int *chosen_index)

{
  bool bVar1;
  int iVar2;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> pdf;
  float *pfVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  if (pdf_first < pdf_last) {
    fVar5 = 0.0;
    for (pfVar3 = pdf_first; pfVar3 != pdf_last; pfVar3 = pfVar3 + 1) {
      fVar6 = *pfVar3;
      if (fVar6 < 0.0) {
        *pfVar3 = 0.0;
        fVar6 = 0.0;
      }
      fVar5 = fVar5 + fVar6;
    }
    fVar6 = 0.0;
    if ((fVar5 == 0.0) && (!NAN(fVar5))) {
      *chosen_index = 0;
      *pdf_first = 1.0;
      return 0;
    }
    fVar8 = ((float)((uint)(seed * 0x66d5deece66d + 0x7fffffffU >> 0x19) & 0x7fffff | 0x3f800000) +
            -1.0) * fVar5;
    fVar7 = fVar5;
    if (fVar8 <= fVar5) {
      fVar7 = fVar8;
    }
    iVar4 = -1;
    bVar1 = false;
    for (; pdf_first != pdf_last; pdf_first = pdf_first + 1) {
      iVar4 = iVar4 + 1;
      fVar8 = *pdf_first;
      fVar6 = fVar6 + fVar8;
      if ((!bVar1) && (fVar7 < fVar6)) {
        *chosen_index = iVar4;
        fVar8 = *pdf_first;
        bVar1 = true;
      }
      *pdf_first = fVar8 / fVar5;
    }
    iVar2 = 0;
    if (!bVar1) {
      *chosen_index = iVar4;
      return iVar2;
    }
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int sample_after_normalizing(uint64_t seed, It pdf_first, It pdf_last, uint32_t& chosen_index, std::input_iterator_tag /* pdf_category */)
  {
    if (pdf_first == pdf_last || pdf_last < pdf_first)
      return E_EXPLORATION_BAD_RANGE;
    // Create a discrete_distribution based on the returned weights. This class handles the
    // case where the sum of the weights is < or > 1, by normalizing agains the sum.
    float total = 0.f;
    for (It pdf = pdf_first; pdf != pdf_last; ++pdf)
    {
      if (*pdf < 0)
        *pdf = 0;

      total += *pdf;
    }

    // assume the first is the best
    if (total == 0)
    {
      chosen_index = 0;
      *pdf_first = 1;
      return S_EXPLORATION_OK;
    }

    float draw = total * uniform_random_merand48(seed);
    if (draw > total) //make very sure that draw can not be greater than total.
      draw = total;

    bool index_found = false; //found chosen action
    float sum = 0.f;
    uint32_t i = 0;
    for (It pdf = pdf_first; pdf != pdf_last; ++pdf, ++i)
    {
      sum += *pdf;
      if (!index_found && sum > draw)
      {
        chosen_index = i;
        index_found = true;
      }
      *pdf /= total;
    }

    if(!index_found)
      chosen_index = i - 1;

    return S_EXPLORATION_OK;
  }